

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ogf_v3::progressive(xr_ogf_v3 *this)

{
  ogf_model_type oVar1;
  xr_ogf_v3 *this_local;
  
  oVar1 = (this->super_xr_ogf).m_model_type;
  this_local._7_1_ = oVar1 == MT3_PROGRESSIVE || oVar1 == MT3_SKELETON_GEOMDEF_PM;
  return this_local._7_1_;
}

Assistant:

bool xr_ogf_v3::progressive() const
{
	switch (m_model_type) {
	case MT3_PROGRESSIVE:
	case MT3_SKELETON_GEOMDEF_PM:
		return true;
	default:
		return false;
	}
}